

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O3

SRes crnlib::LzmaEnc_CodeOneBlock
               (CLzmaEnc *p,Bool useLimits,UInt32 maxPackSize,UInt32 maxUnpackSize)

{
  byte bVar1;
  byte bVar2;
  UInt16 *pUVar3;
  CRangeEnc *p_00;
  UInt16 (*paUVar4) [64];
  byte bVar5;
  UInt32 UVar6;
  uint uVar7;
  uint uVar8;
  UInt32 UVar9;
  UInt32 UVar10;
  SRes SVar11;
  Byte *pBVar12;
  undefined4 extraout_var;
  COptimal *pCVar13;
  uint uVar14;
  UInt32 *pUVar15;
  undefined1 *puVar16;
  COptimal *pCVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  Byte *pBVar22;
  uint uVar23;
  int iVar24;
  CRangeEnc *pCVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  Byte *pBVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  UInt32 m_2;
  ulong uVar35;
  UInt32 m_1;
  ulong uVar36;
  Byte *pBVar37;
  uint uVar38;
  UInt32 m;
  uint uVar39;
  bool bVar40;
  int iVar45;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar52;
  int iVar53;
  int iVar55;
  undefined1 auVar54 [16];
  int iVar57;
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  UInt32 numPairs;
  UInt32 numPairs_1;
  UInt32 repLens [4];
  ulong local_250;
  UInt32 local_248;
  uint local_244;
  ulong local_240;
  UInt32 *local_238;
  COptimal *local_230;
  ulong local_228;
  ulong local_220;
  UInt32 local_214;
  Byte *local_210;
  Byte *local_208;
  uint local_1fc;
  ulong local_1f8;
  ulong local_1f0;
  UInt16 (*local_1e8) [16];
  ulong local_1e0;
  uint local_1d8 [3];
  UInt32 UStack_1cc;
  UInt16 *local_1c0;
  ulong local_1b8;
  Byte *local_1b0;
  uint local_1a4;
  uint local_1a0;
  uint local_19c;
  UInt16 (*local_198) [16];
  ulong local_190;
  ulong local_188;
  CRangeEnc *local_180;
  ulong local_178;
  COptimal *local_170;
  ulong local_168;
  UInt32 (*local_160) [272];
  UInt32 *local_158;
  uint local_14c;
  UInt32 *local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  UInt32 (*local_128) [272];
  UInt16 *local_120;
  undefined8 local_118;
  ulong local_110;
  long local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  uint local_e4;
  uint local_e0;
  int local_dc;
  uint local_d8;
  uint local_d4;
  UInt32 local_d0;
  Bool local_cc;
  uint local_c8 [4];
  UInt16 *local_b8;
  UInt16 *local_b0;
  UInt32 (*local_a8) [64];
  UInt32 (*local_a0) [128];
  UInt32 *local_98;
  UInt32 *local_90;
  UInt16 *local_88;
  UInt16 *local_80;
  UInt16 *local_78;
  ulong local_70;
  CLenPriceEnc *local_68;
  UInt16 *local_60;
  ulong local_58;
  UInt16 (*local_50) [64];
  CLenPriceEnc *local_48;
  Byte *local_40;
  ulong local_38;
  
  local_d0 = maxUnpackSize;
  local_cc = useLimits;
  if (p->inStream != (ISeqInStream *)0x0) {
    (p->matchFinderBase).stream = p->inStream;
    (*(p->matchFinder).Init)(p->matchFinderObj);
    p->inStream = (ISeqInStream *)0x0;
  }
  if (p->finished != 0 || p->result != 0) {
    return p->result;
  }
  if ((p->rc).res == 0) {
    if ((p->matchFinderBase).result == 0) {
      local_f8 = p->nowPos64;
      uVar35 = local_f8 & 0xffffffff;
      if (local_f8 == 0) {
        UVar6 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
        if (UVar6 == 0) {
          UVar6 = (UInt32)local_f8;
          goto LAB_001a2586;
        }
        ReadMatchDistances(p,local_1d8);
        RangeEnc_EncodeBit(&p->rc,p->isMatch[p->state],0);
        p->state = *(UInt32 *)(kLiteralNextStates + (ulong)p->state * 4);
        bVar5 = (*(p->matchFinder).GetIndexByte)(p->matchFinderObj,-p->additionalOffset);
        pUVar3 = p->litProbs;
        uVar8 = bVar5 | 0x100;
        do {
          RangeEnc_EncodeBit(&p->rc,(UInt16 *)((ulong)(uVar8 >> 7 & 0x1fffffe) + (long)pUVar3),
                             uVar8 >> 7 & 1);
          bVar40 = uVar8 < 0x8000;
          uVar8 = uVar8 * 2;
        } while (bVar40);
        p->additionalOffset = p->additionalOffset - 1;
        uVar35 = 1;
      }
      UVar6 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
      if (UVar6 != 0) {
        local_90 = &p->numPairs;
        local_158 = p->reps;
        local_230 = p->opt;
        local_238 = p->ProbPrices;
        local_1e8 = p->isMatch;
        local_120 = p->isRep;
        local_1c0 = p->isRepG0;
        local_198 = p->isRep0Long;
        local_148 = p->opt[0].backs;
        local_128 = (p->repLenEnc).prices;
        local_160 = (p->lenEnc).prices;
        local_a8 = p->posSlotPrices;
        local_a0 = p->distancesPrices;
        local_40 = (Byte *)(ulong)maxPackSize;
        local_180 = &p->rc;
        local_48 = &p->lenEnc;
        local_50 = p->posSlotEncoder;
        local_80 = p->posAlignEncoder;
        local_88 = p->posEncoders;
        local_60 = p->isRepG1;
        local_78 = p->isRepG2;
        local_68 = &p->repLenEnc;
        local_98 = p->ProbPrices + 0x7d;
        local_b8 = (p->repLenEnc).p.high + 0xfc;
        local_170 = p->opt + 4;
        do {
          do {
            local_220 = uVar35;
            if (p->fastMode == 0) {
              uVar8 = p->optimumCurrentIndex;
              if (p->optimumEndIndex == uVar8) {
                p->optimumEndIndex = 0;
                p->optimumCurrentIndex = 0;
                if (p->additionalOffset == 0) {
                  UVar6 = ReadMatchDistances(p,&local_19c);
                }
                else {
                  UVar6 = p->longestMatchLength;
                  local_19c = p->numPairs;
                }
                uVar8 = p->numAvail;
                uVar36 = 0xffffffff;
                if (uVar8 < 2) {
LAB_001a00d5:
                  uVar8 = 1;
                }
                else {
                  uVar7 = 0x111;
                  if (uVar8 < 0x111) {
                    uVar7 = uVar8;
                  }
                  pBVar12 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                  bVar5 = pBVar12[-1];
                  if (uVar7 < 4) {
                    uVar7 = 3;
                  }
                  uVar21 = *(ulong *)local_158;
                  local_1d8[0] = (uint)uVar21;
                  local_1d8[1] = (uint)(uVar21 >> 0x20);
                  local_1d8[2] = (uint)*(ulong *)(local_158 + 2);
                  UStack_1cc = (UInt32)(*(ulong *)(local_158 + 2) >> 0x20);
                  uVar20 = 0;
                  uVar36 = 0;
                  do {
                    if ((bVar5 == pBVar12[~(ulong)(local_158[uVar20] + 1)]) &&
                       (lVar29 = -(ulong)(local_158[uVar20] + 1), *pBVar12 == pBVar12[lVar29])) {
                      uVar19 = 2;
                      if (uVar8 != 2) {
                        uVar30 = 2;
                        do {
                          uVar19 = uVar30;
                          if (pBVar12[uVar30 - 1] != pBVar12[uVar30 + lVar29 + -1]) break;
                          uVar30 = uVar30 + 1;
                          uVar19 = (ulong)uVar7;
                        } while (uVar7 != uVar30);
                      }
                      local_c8[uVar20] = (uint)uVar19;
                      if (local_c8[uVar36] < (uint)uVar19) {
                        uVar36 = uVar20 & 0xffffffff;
                      }
                    }
                    else {
                      local_c8[uVar20] = 0;
                    }
                    uVar20 = uVar20 + 1;
                  } while (uVar20 != 4);
                  uVar8 = local_c8[uVar36];
                  if (uVar8 < p->numFastBytes) {
                    if (UVar6 < p->numFastBytes) {
                      bVar1 = pBVar12[~(ulong)(local_1d8[0] + 1)];
                      if (((uVar8 < 2) && (UVar6 < 2)) && (bVar5 != bVar1)) {
                        local_248 = 0xffffffff;
                        goto LAB_001a024e;
                      }
                      uVar20 = (ulong)p->state;
                      p->opt[0].state = p->state;
                      bVar2 = (byte)p->lc;
                      uVar7 = p->pbMask & (uint)uVar35;
                      uVar19 = (ulong)uVar7;
                      uVar23 = (uint)(local_1e8[uVar20][uVar19] >> 4);
                      UVar10 = p->ProbPrices[uVar23];
                      local_1e0 = CONCAT71(local_1e0._1_7_,bVar1);
                      local_228 = uVar20;
                      local_110 = uVar21 & 0xffffffff;
                      if (uVar20 < 7) {
                        UVar9 = 0;
                        uVar38 = bVar5 + 0x100;
                        do {
                          UVar9 = UVar9 + local_238[((uint)(int)(char)uVar38 >> 7 & 0x7f0 ^
                                                    (uint)(p->litProbs +
                                                          ((uint)(pBVar12[-2] >> (8 - bVar2 & 0x1f))
                                                          + ((p->lpMask & (uint)uVar35) <<
                                                            (bVar2 & 0x1f))) * 0x300)[uVar38 >> 8])
                                                    >> 4];
                          bVar40 = uVar38 < 0x8000;
                          uVar38 = uVar38 * 2;
                        } while (bVar40);
                      }
                      else {
                        UVar9 = LitEnc_GetPriceMatched
                                          (p->litProbs +
                                           ((uint)(pBVar12[-2] >> (8 - bVar2 & 0x1f)) +
                                           ((p->lpMask & (uint)uVar35) << (bVar2 & 0x1f))) * 0x300,
                                           (uint)bVar5,(uint)bVar1,local_238);
                      }
                      pUVar3 = local_b8;
                      auVar58 = _DAT_001a70c0;
                      auVar60 = _DAT_001a7020;
                      auVar59 = _DAT_001a7010;
                      uVar38 = UVar9 + UVar10;
                      p->opt[1].price = uVar38;
                      p->opt[1].backPrev = 0xffffffff;
                      p->opt[1].prev1IsChar = 0;
                      local_214 = p->ProbPrices[uVar23 ^ 0x7f];
                      uVar23 = (uint)(p->isRep[local_228] >> 4);
                      local_240 = CONCAT44(local_240._4_4_,uVar23);
                      iVar26 = *(int *)((long)p->ProbPrices + (ulong)((uVar23 ^ 0x7f) << 2)) +
                               local_214;
                      uVar36 = 0xffffffff;
                      if ((bVar5 == (byte)local_1e0) &&
                         (uVar23 = local_238[local_1c0[local_228] >> 4] + iVar26 +
                                   local_238[local_198[uVar20][uVar19] >> 4], uVar23 < uVar38)) {
                        p->opt[1].price = uVar23;
                        p->opt[1].backPrev = 0;
                        uVar36 = 0;
                      }
                      if (uVar8 < UVar6) {
                        uVar8 = UVar6;
                      }
                      local_250 = (ulong)uVar8;
                      if (uVar8 < 2) {
                        local_248 = (UInt32)uVar36;
                        uVar35 = local_220;
                        uVar8 = 1;
                      }
                      else {
                        p->opt[1].posPrev = 0;
                        uVar35 = *(ulong *)(local_158 + 2);
                        *(ulong *)local_148 = *(ulong *)local_158;
                        *(ulong *)(local_148 + 2) = uVar35;
                        lVar29 = (ulong)(uVar8 - 1) - 1;
                        auVar56._8_4_ = (int)lVar29;
                        auVar56._0_8_ = lVar29;
                        auVar56._12_4_ = (int)((ulong)lVar29 >> 0x20);
                        pCVar17 = local_230 + local_250;
                        uVar35 = 0;
                        do {
                          auVar46._8_4_ = (int)uVar35;
                          auVar46._0_8_ = uVar35;
                          auVar46._12_4_ = (int)(uVar35 >> 0x20);
                          auVar54 = (auVar46 | auVar59) ^ auVar60;
                          iVar24 = SUB164(auVar56 ^ auVar60,0);
                          bVar40 = iVar24 < auVar54._0_4_;
                          iVar45 = SUB164(auVar56 ^ auVar60,4);
                          iVar52 = auVar54._4_4_;
                          if ((bool)(~(iVar45 < iVar52 || iVar52 == iVar45 && bVar40) & 1)) {
                            pCVar17->price = 0x40000000;
                          }
                          if (iVar45 >= iVar52 && (iVar52 != iVar45 || !bVar40)) {
                            pCVar17[-1].price = 0x40000000;
                          }
                          auVar46 = (auVar46 | auVar58) ^ auVar60;
                          iVar52 = auVar46._4_4_;
                          if (iVar52 <= iVar45 && (iVar52 != iVar45 || auVar46._0_4_ <= iVar24)) {
                            pCVar17[-2].price = 0x40000000;
                            pCVar17[-3].price = 0x40000000;
                          }
                          uVar35 = uVar35 + 4;
                          pCVar17 = pCVar17 + -4;
                        } while (((ulong)(uVar8 - 1) + 3 & 0xfffffffffffffffc) != uVar35);
                        local_1e0 = uVar19 * 0x440;
                        lVar29 = 0;
                        uVar35 = local_228;
                        pCVar17 = local_230;
                        do {
                          uVar36 = (ulong)local_c8[lVar29];
                          if (1 < uVar36) {
                            UVar10 = GetPureRepPrice(p,(UInt32)lVar29,(UInt32)uVar35,uVar7);
                            pCVar13 = local_230 + uVar36;
                            do {
                              uVar36 = uVar36 - 1;
                              uVar8 = *(int *)(pUVar3 + uVar19 * 0x220 + uVar36 * 2 + 2) +
                                      UVar10 + iVar26;
                              if (uVar8 < pCVar13->price) {
                                pCVar13->price = uVar8;
                                pCVar13->posPrev = 0;
                                pCVar13->backPrev = (UInt32)lVar29;
                                pCVar13->prev1IsChar = 0;
                              }
                              pCVar13 = pCVar13 + -1;
                              uVar35 = local_228;
                              pCVar17 = local_230;
                            } while ((uVar36 & 0xfffffffe) != 0);
                          }
                          lVar29 = lVar29 + 1;
                        } while (lVar29 != 4);
                        uVar35 = (ulong)(local_c8[0] + 1);
                        if (local_c8[0] < 2) {
                          uVar35 = 2;
                        }
                        if ((uint)uVar35 <= UVar6) {
                          UVar6 = local_238[local_240 & 0xffff];
                          uVar36 = 0xfffffffe;
                          do {
                            uVar36 = (ulong)((int)uVar36 + 2);
                          } while (p->matches[uVar36] < (uint)uVar35);
                          while( true ) {
                            uVar8 = p->matches[(int)uVar36 + 1];
                            uVar7 = (uint)uVar35;
                            uVar23 = 3;
                            if (uVar7 < 5) {
                              uVar23 = uVar7 - 2;
                            }
                            if ((ulong)uVar8 < 0x80) {
                              UVar10 = local_a0[uVar23][uVar8];
                            }
                            else {
                              iVar26 = 6;
                              if (-1 < (int)(uVar8 - 0x80000)) {
                                iVar26 = 0x12;
                              }
                              UVar10 = local_a8[uVar23]
                                       [(uint)p->g_FastPos[uVar8 >> (sbyte)iVar26] + iVar26 * 2] +
                                       p->alignPrices[uVar8 & 0xf];
                              pCVar17 = local_230;
                            }
                            uVar23 = *(int *)((long)*local_160 + (ulong)(uVar7 - 2) * 4 + local_1e0)
                                     + local_214 + UVar6 + UVar10;
                            if (uVar23 < pCVar17[uVar35].price) {
                              pCVar13 = pCVar17 + uVar35;
                              pCVar13->price = uVar23;
                              pCVar13->posPrev = 0;
                              pCVar13->backPrev = uVar8 + 4;
                              pCVar13->prev1IsChar = 0;
                            }
                            uVar8 = (int)uVar36 + 2;
                            if ((uVar7 == p->matches[uVar36]) && (uVar8 == local_19c)) break;
                            if (uVar7 == p->matches[uVar36]) {
                              uVar36 = (ulong)uVar8;
                            }
                            uVar35 = (ulong)(uVar7 + 1);
                          }
                        }
                        local_100 = (ulong)((int)local_220 + 1);
                        local_1f8 = 0xffe;
                        local_108 = 1;
                        local_240 = 0;
                        local_138 = local_220 & 0xffffffff;
                        do {
                          uVar21 = local_110;
                          uVar36 = local_138;
                          uVar35 = local_220;
                          uVar19 = local_138 & 0xffffffff;
                          local_1f0 = local_240;
                          UVar10 = (int)local_240 + 1;
                          uVar20 = (ulong)UVar10;
                          UVar6 = ReadMatchDistances(p,&local_1a0);
                          local_118 = CONCAT44(extraout_var,UVar6);
                          if (p->numFastBytes <= UVar6) {
                            p->numPairs = local_1a0;
                            p->longestMatchLength = UVar6;
                            break;
                          }
                          pCVar17 = local_230 + uVar20;
                          uVar8 = local_230[uVar20].posPrev;
                          uVar35 = (ulong)uVar8;
                          local_240 = uVar20;
                          if (local_230[uVar20].prev1IsChar == 0) {
                            uVar7 = local_230[uVar35].state;
                            uVar20 = (ulong)uVar7;
                            if (uVar8 == (uint)local_1f0) goto LAB_001a0ed9;
LAB_001a0f10:
                            uVar23 = pCVar17->backPrev;
                            if (3 < uVar23) {
                              uVar8 = *(uint *)(kMatchNextStates + (ulong)uVar7 * 4);
                              goto LAB_001a0f8d;
                            }
                            uVar8 = *(uint *)(kRepNextStates + (ulong)uVar7 * 4);
LAB_001a0f1e:
                            uVar7 = local_230[uVar35].backs[uVar23];
                            local_1d8[0] = uVar7;
                            if (uVar23 == 0) {
                              iVar26 = 1;
LAB_001a0fc8:
                              memcpy((void *)((long)local_1d8 + (ulong)(uint)(iVar26 << 2)),
                                     (void *)((long)local_148 +
                                             (ulong)(uint)(iVar26 << 2) + uVar35 * 0x30),
                                     (ulong)(uVar23 * -4 + 0xc));
                              uVar7 = local_1d8[0];
                            }
                            else {
                              memcpy(local_1d8 + 1,local_148 + uVar35 * 0xc,(ulong)uVar23 * 4);
                              if (uVar23 < 3) {
                                iVar26 = uVar23 + 1;
                                goto LAB_001a0fc8;
                              }
                            }
                            uVar21 = (ulong)uVar7;
                          }
                          else {
                            uVar8 = uVar8 - 1;
                            if (pCVar17->prev2 == 0) {
                              uVar35 = (ulong)uVar8;
                              uVar7 = *(uint *)(kLiteralNextStates +
                                               (ulong)local_230[uVar35].state * 4);
                              uVar20 = (ulong)uVar7;
                              if (uVar8 != (uint)local_1f0) goto LAB_001a0f10;
                            }
                            else {
                              uVar35 = (ulong)pCVar17->posPrev2;
                              uVar23 = pCVar17->backPrev2;
                              puVar16 = kMatchNextStates;
                              if (uVar23 < 4) {
                                puVar16 = kRepNextStates;
                              }
                              uVar20 = (ulong)*(uint *)(kLiteralNextStates +
                                                       (ulong)*(uint *)(puVar16 +
                                                                       (ulong)local_230[uVar35].
                                                                              state * 4) * 4);
                              if (uVar8 != (uint)local_1f0) {
                                uVar8 = *(uint *)(kRepNextStates + uVar20 * 4);
                                if (uVar23 < 4) goto LAB_001a0f1e;
LAB_001a0f8d:
                                local_1d8[0] = uVar23 - 4;
                                UStack_1cc = local_148[uVar35 * 0xc + 2];
                                local_1d8[1] = (uint)*(undefined8 *)(local_148 + uVar35 * 0xc);
                                local_1d8[2] = (uint)((ulong)*(undefined8 *)
                                                              (local_148 + uVar35 * 0xc) >> 0x20);
                                uVar21 = (ulong)local_1d8[0];
                                goto LAB_001a1001;
                              }
                            }
LAB_001a0ed9:
                            if (pCVar17->backPrev == 0) {
                              puVar16 = kShortRepNextStates;
                            }
                            else {
                              puVar16 = kLiteralNextStates;
                            }
                            uVar8 = *(uint *)(puVar16 + uVar20 * 4);
                          }
LAB_001a1001:
                          uVar23 = (int)uVar36 + 1;
                          pCVar17->state = uVar8;
                          pCVar17->backs[0] = (UInt32)uVar21;
                          *(ulong *)(pCVar17->backs + 1) = CONCAT44(local_1d8[2],local_1d8[1]);
                          pCVar17->backs[3] = UStack_1cc;
                          UVar6 = pCVar17->price;
                          local_178 = uVar19;
                          local_210 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                          local_1b0 = local_210 + -1;
                          local_1e0 = (ulong)((UInt32)uVar21 + 1);
                          local_168 = CONCAT44(local_168._4_4_,p->pbMask);
                          local_1b8 = (ulong)(p->pbMask & uVar23);
                          uVar35 = (ulong)uVar8;
                          uVar7 = (uint)(local_1e8[uVar35][local_1b8] >> 4);
                          local_d4 = p->lc;
                          local_d8 = p->lpMask;
                          local_dc = 8 - local_d4;
                          UVar10 = p->ProbPrices[uVar7];
                          local_b0 = p->litProbs;
                          pUVar3 = p->litProbs +
                                   ((uint)(local_210[-2] >> ((byte)local_dc & 0x1f)) +
                                   ((local_d8 & uVar23) << ((byte)local_d4 & 0x1f))) * 0x300;
                          bVar5 = local_210[-1];
                          local_228 = CONCAT44(local_228._4_4_,(uint)local_1b0[-local_1e0]);
                          local_188 = uVar35;
                          local_138 = (ulong)uVar23;
                          local_110 = uVar21;
                          if (uVar8 < 7) {
                            UVar9 = 0;
                            uVar8 = bVar5 + 0x100;
                            do {
                              UVar9 = UVar9 + local_238[((uint)(int)(char)uVar8 >> 7 & 0x7f0 ^
                                                        (uint)pUVar3[uVar8 >> 8]) >> 4];
                              bVar40 = uVar8 < 0x8000;
                              uVar8 = uVar8 * 2;
                            } while (bVar40);
                          }
                          else {
                            UVar9 = LitEnc_GetPriceMatched
                                              (pUVar3,(uint)bVar5,(uint)local_1b0[-local_1e0],
                                               local_238);
                          }
                          pUVar3 = local_b8;
                          uVar36 = local_1b8;
                          auVar58 = _DAT_001a70c0;
                          auVar60 = _DAT_001a7020;
                          auVar59 = _DAT_001a7010;
                          uVar39 = UVar10 + UVar6 + UVar9;
                          uVar23 = (int)local_1f0 + 2;
                          pCVar17 = local_230 + uVar23;
                          bVar40 = uVar39 < local_230[uVar23].price;
                          uVar38 = (uint)local_240;
                          uVar8 = local_230[uVar23].price;
                          if (bVar40) {
                            pCVar17->price = uVar39;
                            pCVar17->posPrev = uVar38;
                            pCVar17->backPrev = 0xffffffff;
                            pCVar17->prev1IsChar = 0;
                            uVar8 = uVar39;
                          }
                          local_208 = (Byte *)CONCAT44(local_208._4_4_,uVar39);
                          local_214 = UVar6 + local_238[uVar7 ^ 0x7f];
                          local_e4 = (uint)(local_120[local_188] >> 4);
                          local_1fc = *(int *)((long)local_238 + (ulong)((local_e4 ^ 0x7f) << 2)) +
                                      local_214;
                          if (((byte)local_228 == bVar5) &&
                             (((uVar38 <= pCVar17->posPrev || (pCVar17->backPrev != 0)) &&
                              (uVar7 = local_238[local_1c0[local_188] >> 4] + local_1fc +
                                       local_238[local_198[uVar35][local_1b8] >> 4], uVar7 <= uVar8)
                              ))) {
                            pCVar17->price = uVar7;
                            pCVar17->posPrev = uVar38;
                            pCVar17->backPrev = 0;
                            pCVar17->prev1IsChar = 0;
                            bVar40 = true;
                          }
                          uVar35 = local_1f8 & 0xffffffff;
                          uVar8 = p->numAvail;
                          local_140 = (ulong)uVar8;
                          uVar7 = 0xffe - (int)local_1f0;
                          if (uVar8 <= uVar7) {
                            uVar7 = uVar8;
                          }
                          if (1 < uVar7) {
                            uVar27 = p->numFastBytes;
                            local_190 = (ulong)uVar27;
                            uVar28 = uVar27;
                            if (uVar7 < uVar27) {
                              uVar28 = uVar7;
                            }
                            local_e0 = (uint)local_1f8;
                            if (!bVar40 && (byte)local_228 != bVar5) {
                              uVar14 = uVar27 + 1;
                              uVar18 = uVar7;
                              if (uVar14 < uVar7) {
                                uVar18 = uVar14;
                              }
                              if (1 < uVar18) {
                                uVar18 = local_e0;
                                if (uVar8 < local_e0) {
                                  uVar18 = uVar8;
                                }
                                if (uVar14 <= uVar18) {
                                  uVar18 = uVar14;
                                }
                                uVar21 = uVar35;
                                if (local_140 < uVar35) {
                                  uVar21 = local_140;
                                }
                                if (uVar14 <= uVar21) {
                                  uVar21 = (ulong)uVar14;
                                }
                                uVar20 = 1;
                                do {
                                  uVar19 = uVar20;
                                  if (local_210[uVar20 - 1] != local_210[uVar20 + (-1 - local_1e0)])
                                  break;
                                  uVar20 = uVar20 + 1;
                                  uVar19 = (ulong)uVar18;
                                } while (uVar21 != uVar20);
                                iVar26 = (int)uVar19;
                                if (1 < iVar26 - 1U) {
                                  uVar18 = *(uint *)(kLiteralNextStates + local_188 * 4);
                                  uVar32 = (int)local_178 + 2U & (uint)local_168;
                                  iVar24 = *(int *)((long)local_238 +
                                                   (ulong)(local_1e8[uVar18][uVar32] >> 2 &
                                                           0xfffffffc ^ 0x1fc));
                                  iVar45 = *(int *)((long)local_238 +
                                                   (ulong)(local_120[uVar18] >> 2 & 0xfffffffc ^
                                                          0x1fc));
                                  uVar14 = (iVar26 - 1U) + uVar23;
                                  if ((uint)local_250 < uVar14) {
                                    lVar33 = (uVar38 + iVar26) - local_250;
                                    lVar29 = lVar33 + -1;
                                    auVar54._8_4_ = (int)lVar29;
                                    auVar54._0_8_ = lVar29;
                                    auVar54._12_4_ = (int)((ulong)lVar29 >> 0x20);
                                    pCVar17 = local_170 + local_250;
                                    uVar21 = 0;
                                    do {
                                      auVar47._8_4_ = (int)uVar21;
                                      auVar47._0_8_ = uVar21;
                                      auVar47._12_4_ = (int)(uVar21 >> 0x20);
                                      auVar56 = (auVar47 | auVar59) ^ auVar60;
                                      iVar52 = SUB164(auVar54 ^ auVar60,0);
                                      bVar40 = iVar52 < auVar56._0_4_;
                                      iVar53 = SUB164(auVar54 ^ auVar60,4);
                                      iVar55 = auVar56._4_4_;
                                      if ((bool)(~(iVar53 < iVar55 || iVar55 == iVar53 && bVar40) &
                                                1)) {
                                        pCVar17[-3].price = 0x40000000;
                                      }
                                      if (iVar53 >= iVar55 && (iVar55 != iVar53 || !bVar40)) {
                                        pCVar17[-2].price = 0x40000000;
                                      }
                                      auVar56 = (auVar47 | auVar58) ^ auVar60;
                                      iVar55 = auVar56._4_4_;
                                      if (iVar55 <= iVar53 &&
                                          (iVar55 != iVar53 || auVar56._0_4_ <= iVar52)) {
                                        pCVar17[-1].price = 0x40000000;
                                        pCVar17->price = 0x40000000;
                                      }
                                      uVar21 = uVar21 + 4;
                                      pCVar17 = pCVar17 + 4;
                                      local_250 = (ulong)(uVar38 + iVar26);
                                    } while ((lVar33 + 3U & 0xfffffffffffffffc) != uVar21);
                                  }
                                  uVar38 = iVar24 + uVar39 + iVar45 + local_128[uVar32][iVar26 - 3]
                                           + local_238[local_1c0[uVar18] >> 4] +
                                           *(int *)((long)local_238 +
                                                   (ulong)(local_198[uVar18][uVar32] >> 2 &
                                                           0xfffffffc ^ 0x1fc));
                                  if (uVar38 < local_230[uVar14].price) {
                                    pCVar17 = local_230 + uVar14;
                                    pCVar17->price = uVar38;
                                    pCVar17->posPrev = uVar23;
                                    pCVar17->backPrev = 0;
                                    pCVar17->prev1IsChar = 1;
                                    pCVar17->prev2 = 0;
                                  }
                                }
                              }
                            }
                            if (uVar8 < uVar27) {
                              uVar27 = uVar8;
                            }
                            local_70 = (ulong)uVar27;
                            if (local_e0 <= uVar27) {
                              local_70 = uVar35;
                            }
                            if (uVar8 < local_e0) {
                              local_e0 = uVar8;
                            }
                            local_58 = local_140;
                            if (local_190 < local_140) {
                              local_58 = local_190;
                            }
                            if (uVar35 <= local_58) {
                              local_58 = uVar35;
                            }
                            local_1e0 = local_1b8 * 0x440;
                            pBVar31 = (Byte *)0x2;
                            lVar29 = 0;
                            pBVar12 = local_210;
                            pBVar37 = local_1b0;
                            pCVar17 = local_230;
                            uVar21 = local_250;
                            uVar20 = local_240;
                            local_244 = uVar28;
                            local_1f8 = uVar35;
                            local_14c = uVar7;
                            do {
                              pBVar22 = pBVar37 + -(ulong)(local_1d8[lVar29] + 1);
                              local_250 = uVar21;
                              if ((*pBVar37 == *pBVar22) && (*pBVar12 == pBVar22[1])) {
                                uVar35 = 2;
                                if (2 < uVar28) {
                                  uVar19 = 2;
                                  do {
                                    uVar35 = uVar19;
                                    if (pBVar12[uVar19 - 1] !=
                                        pBVar12[uVar19 + (-1 - (ulong)(local_1d8[lVar29] + 1))])
                                    break;
                                    uVar19 = uVar19 + 1;
                                    uVar35 = local_70;
                                  } while (local_58 != uVar19);
                                }
                                iVar26 = (int)uVar35;
                                uVar7 = iVar26 + (UInt32)uVar20;
                                local_178 = (ulong)uVar7;
                                uVar8 = (uint)uVar21;
                                if ((uint)uVar21 < uVar7) {
                                  lVar33 = ~uVar21 + (ulong)uVar7;
                                  auVar41._8_4_ = (int)lVar33;
                                  auVar41._0_8_ = lVar33;
                                  auVar41._12_4_ = (int)((ulong)lVar33 >> 0x20);
                                  pCVar17 = local_170 + uVar21;
                                  uVar19 = 0;
                                  do {
                                    auVar48._8_4_ = (int)uVar19;
                                    auVar48._0_8_ = uVar19;
                                    auVar48._12_4_ = (int)(uVar19 >> 0x20);
                                    auVar56 = (auVar48 | auVar59) ^ auVar60;
                                    iVar24 = SUB164(auVar41 ^ auVar60,0);
                                    bVar40 = iVar24 < auVar56._0_4_;
                                    iVar45 = SUB164(auVar41 ^ auVar60,4);
                                    iVar52 = auVar56._4_4_;
                                    if ((bool)(~(iVar45 < iVar52 || iVar52 == iVar45 && bVar40) & 1)
                                       ) {
                                      pCVar17[-3].price = 0x40000000;
                                    }
                                    if (iVar45 >= iVar52 && (iVar52 != iVar45 || !bVar40)) {
                                      pCVar17[-2].price = 0x40000000;
                                    }
                                    auVar56 = (auVar48 | auVar58) ^ auVar60;
                                    iVar52 = auVar56._4_4_;
                                    if (iVar52 <= iVar45 &&
                                        (iVar52 != iVar45 || auVar56._0_4_ <= iVar24)) {
                                      pCVar17[-1].price = 0x40000000;
                                      pCVar17->price = 0x40000000;
                                    }
                                    uVar19 = uVar19 + 4;
                                    pCVar17 = pCVar17 + 4;
                                    uVar8 = uVar7;
                                  } while (((local_178 - uVar21) + 3 & 0xfffffffffffffffc) != uVar19
                                          );
                                }
                                local_228 = CONCAT44(local_228._4_4_,uVar8);
                                UVar10 = (UInt32)lVar29;
                                local_208 = pBVar31;
                                UVar6 = GetPureRepPrice(p,UVar10,(UInt32)local_188,(UInt32)local_1b8
                                                       );
                                pUVar15 = local_238;
                                iVar24 = UVar6 + local_1fc;
                                uVar35 = uVar35 & 0xffffffff;
                                uVar19 = uVar35;
                                do {
                                  uVar8 = *(int *)(pUVar3 + uVar36 * 0x220 + uVar19 * 2) + iVar24;
                                  uVar7 = (int)local_108 + (int)uVar19;
                                  if (uVar8 < local_230[uVar7].price) {
                                    pCVar17 = local_230 + uVar7;
                                    pCVar17->price = uVar8;
                                    pCVar17->posPrev = (UInt32)uVar20;
                                    pCVar17->backPrev = UVar10;
                                    pCVar17->prev1IsChar = 0;
                                  }
                                  uVar19 = uVar19 - 1;
                                } while ((uVar19 & 0xfffffffe) != 0);
                                uVar8 = iVar26 + 1;
                                pBVar31 = (Byte *)((ulong)local_208 & 0xffffffff);
                                if (lVar29 == 0) {
                                  pBVar31 = (Byte *)(ulong)uVar8;
                                }
                                uVar23 = (int)local_190 + iVar26 + 1;
                                uVar7 = local_14c;
                                if (uVar23 < local_14c) {
                                  uVar7 = uVar23;
                                }
                                uVar38 = uVar8;
                                if (uVar8 < uVar7) {
                                  uVar7 = uVar23;
                                  if (local_e0 < uVar23) {
                                    uVar7 = local_e0;
                                  }
                                  uVar20 = local_1f8;
                                  if (local_140 < local_1f8) {
                                    uVar20 = local_140;
                                  }
                                  uVar19 = (ulong)uVar8;
                                  if (uVar23 <= uVar20) {
                                    uVar20 = (ulong)uVar23;
                                  }
                                  do {
                                    uVar30 = uVar19;
                                    if (local_1b0[uVar19] != pBVar22[uVar19]) break;
                                    uVar19 = uVar19 + 1;
                                    uVar30 = (ulong)uVar7;
                                  } while (uVar20 != uVar19);
                                  uVar38 = (uint)uVar30;
                                }
                                if (uVar38 - uVar8 < 2) {
                                  local_250 = local_228 & 0xffffffff;
                                  pBVar12 = local_210;
                                  pBVar37 = local_1b0;
                                  pCVar17 = local_230;
                                  uVar20 = local_240;
                                  auVar58 = _DAT_001a70c0;
                                  auVar59 = _DAT_001a7010;
                                  auVar60 = _DAT_001a7020;
                                  uVar28 = local_244;
                                }
                                else {
                                  local_38 = (ulong)*(uint *)(kRepNextStates + local_188 * 4);
                                  uVar7 = iVar26 + (int)local_138;
                                  local_1a4 = *(uint *)((long)*local_128 +
                                                       (ulong)(iVar26 - 2) * 4 + local_1e0);
                                  local_f0 = CONCAT44(local_f0._4_4_,
                                                      local_238[local_1e8[local_38]
                                                                [uVar7 & (uint)local_168] >> 4]);
                                  local_208 = pBVar31;
                                  local_130 = (ulong)(uVar38 - uVar8);
                                  UVar6 = LitEnc_GetPriceMatched
                                                    (local_b0 +
                                                     ((uint)(local_1b0[iVar26 - 1] >>
                                                            ((byte)local_dc & 0x1f)) +
                                                     ((uVar7 & local_d8) << ((byte)local_d4 & 0x1f))
                                                     ) * 0x300,(uint)local_1b0[uVar35],
                                                     (uint)pBVar22[uVar35],local_238);
                                  auVar58 = _DAT_001a70c0;
                                  auVar60 = _DAT_001a7020;
                                  auVar59 = _DAT_001a7010;
                                  uVar8 = *(uint *)(kLiteralNextStates + local_38 * 4);
                                  uVar7 = (int)local_138 + iVar26 + 1U & (uint)local_168;
                                  iVar45 = *(int *)((long)pUVar15 +
                                                   (ulong)(local_1e8[uVar8][uVar7] >> 2 & 0xfffffffc
                                                          ^ 0x1fc));
                                  iVar52 = *(int *)((long)pUVar15 +
                                                   (ulong)(local_120[uVar8] >> 2 & 0xfffffffc ^
                                                          0x1fc));
                                  uVar23 = (int)local_178 + (int)local_130 + 1;
                                  local_250 = local_228 & 0xffffffff;
                                  UVar9 = (UInt32)local_240;
                                  if ((UInt32)local_228 < uVar23) {
                                    local_250 = (ulong)(uVar38 + UVar9);
                                    lVar33 = ~(local_228 & 0xffffffff) + local_250;
                                    auVar42._8_4_ = (int)lVar33;
                                    auVar42._0_8_ = lVar33;
                                    auVar42._12_4_ = (int)((ulong)lVar33 >> 0x20);
                                    uVar35 = (ulong)(iVar26 + UVar9);
                                    if (iVar26 + UVar9 < uVar21) {
                                      uVar35 = uVar21;
                                    }
                                    pCVar17 = local_170 + uVar35;
                                    uVar21 = 0;
                                    do {
                                      auVar49._8_4_ = (int)uVar21;
                                      auVar49._0_8_ = uVar21;
                                      auVar49._12_4_ = (int)(uVar21 >> 0x20);
                                      auVar56 = (auVar49 | auVar59) ^ auVar60;
                                      iVar26 = SUB164(auVar42 ^ auVar60,0);
                                      bVar40 = iVar26 < auVar56._0_4_;
                                      iVar53 = SUB164(auVar42 ^ auVar60,4);
                                      iVar55 = auVar56._4_4_;
                                      if ((bool)(~(iVar53 < iVar55 || iVar55 == iVar53 && bVar40) &
                                                1)) {
                                        pCVar17[-3].price = 0x40000000;
                                      }
                                      if (iVar53 >= iVar55 && (iVar55 != iVar53 || !bVar40)) {
                                        pCVar17[-2].price = 0x40000000;
                                      }
                                      auVar56 = (auVar49 | auVar58) ^ auVar60;
                                      iVar55 = auVar56._4_4_;
                                      if (iVar55 <= iVar53 &&
                                          (iVar55 != iVar53 || auVar56._0_4_ <= iVar26)) {
                                        pCVar17[-1].price = 0x40000000;
                                        pCVar17->price = 0x40000000;
                                      }
                                      uVar21 = uVar21 + 4;
                                      pCVar17 = pCVar17 + 4;
                                    } while (((local_250 - uVar35) + 3 & 0xfffffffffffffffc) !=
                                             uVar21);
                                  }
                                  uVar8 = local_1a4 + iVar24 + UVar6 + (int)local_f0 + iVar52 +
                                          iVar45 + local_128[uVar7][(int)local_130 - 2] +
                                          local_238[local_1c0[uVar8] >> 4] +
                                          *(int *)((long)local_238 +
                                                  (ulong)(local_198[uVar8][uVar7] >> 2 & 0xfffffffc
                                                         ^ 0x1fc));
                                  pBVar12 = local_210;
                                  pBVar31 = local_208;
                                  pBVar37 = local_1b0;
                                  pCVar17 = local_230;
                                  uVar20 = local_240;
                                  uVar28 = local_244;
                                  if (uVar8 < local_230[uVar23].price) {
                                    pCVar13 = local_230 + uVar23;
                                    pCVar13->price = uVar8;
                                    pCVar13->posPrev = (int)local_178 + 1;
                                    pCVar13->backPrev = 0;
                                    pCVar13->prev1IsChar = 1;
                                    pCVar13->prev2 = 1;
                                    pCVar13->posPrev2 = UVar9;
                                    pCVar13->backPrev2 = UVar10;
                                  }
                                }
                              }
                              lVar29 = lVar29 + 1;
                              uVar21 = local_250;
                            } while (lVar29 != 4);
                            uVar8 = (uint)local_118;
                            uVar7 = uVar8;
                            if (uVar28 < uVar8) {
                              local_1a0 = 0;
                              do {
                                uVar7 = local_1a0;
                                local_1a0 = uVar7 + 2;
                              } while (p->matches[uVar7] < uVar28);
                              p->matches[uVar7] = uVar28;
                              uVar7 = uVar28;
                            }
                            uVar35 = local_1f8;
                            if ((uint)pBVar31 <= uVar7) {
                              local_214 = local_214 + local_238[(ushort)local_e4];
                              iVar26 = (int)uVar20;
                              if ((uint)local_250 < uVar7 + iVar26) {
                                if ((uint)local_140 <= uVar8) {
                                  uVar8 = (uint)local_140;
                                }
                                if ((uint)local_190 <= uVar8) {
                                  uVar8 = (uint)local_190;
                                }
                                uVar23 = (uint)local_1f8;
                                uVar7 = uVar23;
                                if (uVar8 < uVar23) {
                                  uVar7 = uVar8;
                                }
                                lVar29 = ~local_250 + (ulong)(uVar7 + iVar26);
                                auVar43._8_4_ = (int)lVar29;
                                auVar43._0_8_ = lVar29;
                                auVar43._12_4_ = (int)((ulong)lVar29 >> 0x20);
                                if (uVar23 <= uVar8) {
                                  uVar8 = uVar23;
                                }
                                lVar29 = (uVar8 + iVar26) - local_250;
                                pCVar13 = local_170 + local_250;
                                uVar35 = 0;
                                do {
                                  auVar50._8_4_ = (int)uVar35;
                                  auVar50._0_8_ = uVar35;
                                  auVar50._12_4_ = (int)(uVar35 >> 0x20);
                                  auVar56 = (auVar50 | auVar59) ^ auVar60;
                                  iVar24 = SUB164(auVar43 ^ auVar60,0);
                                  bVar40 = iVar24 < auVar56._0_4_;
                                  iVar45 = SUB164(auVar43 ^ auVar60,4);
                                  iVar52 = auVar56._4_4_;
                                  if ((bool)(~(iVar45 < iVar52 || iVar52 == iVar45 && bVar40) & 1))
                                  {
                                    pCVar13[-3].price = 0x40000000;
                                  }
                                  if (iVar45 >= iVar52 && (iVar52 != iVar45 || !bVar40)) {
                                    pCVar13[-2].price = 0x40000000;
                                  }
                                  auVar56 = (auVar50 | auVar58) ^ auVar60;
                                  iVar52 = auVar56._4_4_;
                                  if (iVar52 <= iVar45 &&
                                      (iVar52 != iVar45 || auVar56._0_4_ <= iVar24)) {
                                    pCVar13[-1].price = 0x40000000;
                                    pCVar13->price = 0x40000000;
                                  }
                                  uVar35 = uVar35 + 4;
                                  pCVar13 = pCVar13 + 4;
                                  local_250 = (ulong)(uVar7 + iVar26);
                                } while ((lVar29 + 3U & 0xfffffffffffffffc) != uVar35);
                              }
                              uVar36 = 0xfffffffe;
                              do {
                                iVar26 = (int)uVar36;
                                uVar36 = (ulong)(iVar26 + 2);
                              } while (p->matches[uVar36] < (uint)pBVar31);
                              uVar8 = p->matches[iVar26 + 3];
                              uVar35 = (ulong)uVar8;
                              iVar26 = 0x12;
                              if ((int)(uVar8 - 0x80000) < 0) {
                                iVar26 = 6;
                              }
                              uVar8 = (uint)p->g_FastPos[uVar8 >> (sbyte)iVar26] + iVar26 * 2;
                              local_1fc = local_1a0;
                              local_168 = (ulong)(p->numFastBytes + 1);
                              uVar21 = (ulong)pBVar31 & 0xffffffff;
                              do {
                                local_178 = (ulong)uVar8;
                                do {
                                  uVar8 = (uint)uVar35;
                                  uVar7 = (uint)uVar21;
                                  iVar26 = 0;
                                  while( true ) {
                                    uVar23 = uVar7 + iVar26;
                                    uVar20 = (ulong)((uVar7 - 2) + iVar26);
                                    lVar29 = uVar20 * 4;
                                    if (4 < uVar23) {
                                      uVar20 = 3;
                                    }
                                    if (uVar8 < 0x80) {
                                      UVar6 = local_a0[uVar20][uVar35];
                                    }
                                    else {
                                      UVar6 = p->alignPrices[uVar8 & 0xf] +
                                              local_a8[uVar20][local_178];
                                    }
                                    uVar39 = *(int *)((long)*local_160 + lVar29 + local_1e0) +
                                             local_214 + UVar6;
                                    uVar38 = (int)local_1f0 + uVar7 + iVar26 + 1;
                                    if (uVar39 < pCVar17[uVar38].price) {
                                      pCVar13 = pCVar17 + uVar38;
                                      pCVar13->price = uVar39;
                                      pCVar13->posPrev = (UInt32)local_240;
                                      pCVar13->backPrev = uVar8 + 4;
                                      pCVar13->prev1IsChar = 0;
                                    }
                                    if (uVar23 == p->matches[uVar36]) break;
                                    iVar26 = iVar26 + 1;
                                  }
                                  pBVar12 = (Byte *)(ulong)((int)pBVar31 + iVar26 + 1);
                                  lVar29 = (long)local_1b0 - (ulong)(uVar8 + 1);
                                  uVar27 = uVar7 + iVar26 + 1;
                                  uVar38 = (int)local_168 + uVar23;
                                  if (local_14c <= uVar38) {
                                    uVar38 = local_14c;
                                  }
                                  pBVar37 = (Byte *)(ulong)uVar27;
                                  if (uVar27 < uVar38) {
                                    pBVar37 = pBVar12;
                                    do {
                                      if (local_1b0[(long)pBVar37] != pBVar37[lVar29]) break;
                                      pBVar37 = pBVar37 + 1;
                                    } while (pBVar37 < (Byte *)(ulong)uVar38);
                                  }
                                  iVar24 = (int)pBVar37;
                                  uVar38 = (~uVar7 + iVar24) - iVar26;
                                  local_228 = uVar21;
                                  local_210 = pBVar31;
                                  if (1 < uVar38) {
                                    local_f0 = (ulong)*(uint *)(kMatchNextStates + local_188 * 4);
                                    uVar28 = uVar23 + (int)local_100;
                                    local_1a4 = p->pbMask;
                                    local_1b8 = (ulong)(local_1a4 & uVar28);
                                    bVar5 = (byte)p->lc;
                                    local_130 = CONCAT44(local_130._4_4_,
                                                         p->ProbPrices
                                                         [local_1e8[local_f0][local_1b8] >> 4]);
                                    local_244 = uVar27;
                                    local_208 = pBVar12;
                                    local_190 = (ulong)uVar38;
                                    UVar6 = LitEnc_GetPriceMatched
                                                      (local_b0 +
                                                       ((uint)(local_1b0[(uVar7 + iVar26) - 1] >>
                                                              (8 - bVar5 & 0x1f)) +
                                                       ((uVar28 & p->lpMask) << (bVar5 & 0x1f))) *
                                                       0x300,(uint)local_1b0[uVar23],
                                                       (uint)*(byte *)(lVar29 + (ulong)uVar23),
                                                       local_238);
                                    auVar58 = _DAT_001a70c0;
                                    auVar60 = _DAT_001a7020;
                                    auVar59 = _DAT_001a7010;
                                    uVar7 = *(uint *)(kLiteralNextStates + local_f0 * 4);
                                    local_1b8 = (ulong)((int)local_1b8 + 1U & local_1a4);
                                    iVar45 = *(int *)((long)p->ProbPrices +
                                                     (ulong)(local_1e8[uVar7][local_1b8] >> 2 &
                                                             0xfffffffc ^ 0x1fc));
                                    iVar52 = *(int *)((long)p->ProbPrices +
                                                     (ulong)(p->isRep[uVar7] >> 2 & 0xfffffffc ^
                                                            0x1fc));
                                    uVar38 = (int)local_1f0 + uVar23 + (int)local_190 + 2;
                                    if ((uint)local_250 < uVar38) {
                                      local_190 = CONCAT44(local_190._4_4_,UVar6);
                                      uVar35 = (ulong)((UInt32)local_240 + iVar24);
                                      lVar33 = uVar35 - local_250;
                                      lVar29 = lVar33 + -1;
                                      auVar44._8_4_ = (int)lVar29;
                                      auVar44._0_8_ = lVar29;
                                      auVar44._12_4_ = (int)((ulong)lVar29 >> 0x20);
                                      pCVar17 = local_170 + local_250;
                                      uVar21 = 0;
                                      do {
                                        auVar51._8_4_ = (int)uVar21;
                                        auVar51._0_8_ = uVar21;
                                        auVar51._12_4_ = (int)(uVar21 >> 0x20);
                                        auVar56 = (auVar51 | auVar59) ^ auVar60;
                                        iVar53 = SUB164(auVar44 ^ auVar60,0);
                                        bVar40 = iVar53 < auVar56._0_4_;
                                        iVar55 = SUB164(auVar44 ^ auVar60,4);
                                        iVar57 = auVar56._4_4_;
                                        if ((bool)(~(iVar55 < iVar57 || iVar57 == iVar55 && bVar40)
                                                  & 1)) {
                                          pCVar17[-3].price = 0x40000000;
                                        }
                                        if (iVar55 >= iVar57 && (iVar57 != iVar55 || !bVar40)) {
                                          pCVar17[-2].price = 0x40000000;
                                        }
                                        auVar56 = (auVar51 | auVar58) ^ auVar60;
                                        iVar57 = auVar56._4_4_;
                                        if (iVar57 <= iVar55 &&
                                            (iVar57 != iVar55 || auVar56._0_4_ <= iVar53)) {
                                          pCVar17[-1].price = 0x40000000;
                                          pCVar17->price = 0x40000000;
                                        }
                                        uVar21 = uVar21 + 4;
                                        pCVar17 = pCVar17 + 4;
                                        local_250 = uVar35;
                                      } while ((lVar33 + 3U & 0xfffffffffffffffc) != uVar21);
                                    }
                                    uVar7 = (int)local_130 + uVar39 + UVar6 + iVar52 + iVar45 +
                                            local_128[local_1b8]
                                            [((iVar24 - (UInt32)local_228) - iVar26) - 3] +
                                            local_238[local_1c0[uVar7] >> 4] +
                                            *(int *)((long)local_238 +
                                                    (ulong)(local_198[uVar7][local_1b8] >> 2 &
                                                            0xfffffffc ^ 0x1fc));
                                    pBVar12 = local_208;
                                    pCVar17 = local_230;
                                    uVar27 = local_244;
                                    if (uVar7 < local_230[uVar38].price) {
                                      pCVar13 = local_230 + uVar38;
                                      pCVar13->price = uVar7;
                                      pCVar13->posPrev = (int)local_1f0 + uVar23 + 2;
                                      pCVar13->backPrev = 0;
                                      pCVar13->prev1IsChar = 1;
                                      pCVar13->prev2 = 1;
                                      pCVar13->posPrev2 = (UInt32)local_240;
                                      pCVar13->backPrev2 = uVar8 + 4;
                                    }
                                  }
                                  uVar21 = (ulong)uVar27;
                                  iVar24 = (int)uVar36;
                                  uVar8 = iVar24 + 2;
                                  uVar36 = (ulong)uVar8;
                                  uVar35 = local_1f8;
                                  if (uVar8 == local_1fc) goto LAB_001a1cd7;
                                  uVar8 = p->matches[iVar24 + 3];
                                  uVar35 = (ulong)uVar8;
                                  pBVar31 = pBVar12;
                                } while (uVar35 < 0x80);
                                iVar24 = 0x12;
                                if ((int)(uVar8 - 0x80000) < 0) {
                                  iVar24 = 6;
                                }
                                uVar8 = (uint)p->g_FastPos[uVar8 >> (sbyte)iVar24] + iVar24 * 2;
                                pBVar31 = (Byte *)(ulong)((int)local_210 + iVar26 + 1);
                                uVar21 = (ulong)((int)local_228 + iVar26 + 1);
                              } while( true );
                            }
                          }
LAB_001a1cd7:
                          local_1f8 = uVar35;
                          local_108 = local_108 + 1;
                          local_1f8 = (ulong)((int)local_1f8 - 1);
                          local_100 = (ulong)((int)local_100 + 1);
                          UVar10 = (UInt32)local_250;
                          uVar35 = local_220;
                        } while ((UInt32)local_108 != UVar10);
                        uVar8 = Backward(p,&local_248,UVar10);
                        uVar36 = (ulong)local_248;
                      }
                    }
                    else {
                      local_248 = p->matches[local_19c - 1] + 4;
                      uVar36 = (ulong)local_248;
                      UVar10 = UVar6 - 1;
                      if (UVar10 == 0) goto LAB_001a00d5;
                      p->additionalOffset = p->additionalOffset + UVar10;
                      (*(p->matchFinder).Skip)(p->matchFinderObj,UVar10);
                      uVar8 = UVar6;
                    }
                  }
                  else {
                    UVar6 = uVar8 - 1;
                    local_248 = (uint)uVar36;
                    if (UVar6 == 0) goto LAB_001a00d5;
                    p->additionalOffset = p->additionalOffset + UVar6;
                    (*(p->matchFinder).Skip)(p->matchFinderObj,UVar6);
                  }
                }
              }
              else {
                UVar6 = local_230[uVar8].posPrev;
                local_248 = local_230[uVar8].backPrev;
                uVar36 = (ulong)local_248;
                p->optimumCurrentIndex = UVar6;
                uVar8 = UVar6 - uVar8;
              }
            }
            else {
              if (p->additionalOffset == 0) {
                UVar6 = ReadMatchDistances(p,local_1d8);
              }
              else {
                UVar6 = p->longestMatchLength;
                local_1d8[0] = p->numPairs;
              }
              uVar8 = p->numAvail;
              if (uVar8 < 2) {
LAB_0019febf:
                uVar36 = 0xffffffff;
                uVar8 = 1;
              }
              else {
                uVar7 = 0x111;
                if (uVar8 < 0x111) {
                  uVar7 = uVar8;
                }
                pBVar12 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                uVar35 = local_220;
                if (uVar7 < 4) {
                  uVar7 = 3;
                }
                uVar36 = 0;
                uVar21 = 0;
                uVar23 = 0;
                do {
                  if ((pBVar12[-1] == pBVar12[~(ulong)(local_158[uVar36] + 1)]) &&
                     (lVar29 = -(ulong)(local_158[uVar36] + 1), *pBVar12 == pBVar12[lVar29])) {
                    uVar20 = 2;
                    if (uVar8 != 2) {
                      uVar19 = 2;
                      do {
                        uVar20 = uVar19;
                        if (pBVar12[uVar19 - 1] != pBVar12[uVar19 + lVar29 + -1]) break;
                        uVar19 = uVar19 + 1;
                        uVar20 = (ulong)uVar7;
                      } while (uVar7 != uVar19);
                    }
                    uVar38 = (uint)uVar20;
                    uVar39 = (uint)uVar36;
                    if (p->numFastBytes <= uVar38) goto joined_r0x001a026d;
                    if (uVar23 < uVar38) {
                      uVar21 = uVar36 & 0xffffffff;
                      uVar23 = uVar38;
                    }
                  }
                  uVar36 = uVar36 + 1;
                } while (uVar36 != 4);
                uVar38 = UVar6;
                if (UVar6 < p->numFastBytes) {
                  UVar10 = 0;
                  if (1 < UVar6) {
                    uVar36 = (ulong)local_1d8[0];
                    UVar10 = p->matches[local_1d8[0] - 1];
                    if (2 < uVar36) {
                      pUVar15 = local_98 + uVar36;
                      uVar20 = uVar36 + 0xfffffffc;
                      do {
                        UVar9 = p->matches[uVar20 & 0xffffffff];
                        if ((UVar6 != UVar9 + 1) || (uVar7 = *pUVar15, UVar10 >> 7 <= uVar7)) break;
                        uVar38 = (int)uVar36 - 2;
                        uVar36 = (ulong)uVar38;
                        pUVar15 = pUVar15 + -2;
                        uVar20 = uVar20 - 2;
                        UVar6 = UVar9;
                        UVar10 = uVar7;
                      } while (2 < uVar38);
                    }
                    UVar9 = UVar6;
                    if (0x7f < UVar10) {
                      UVar9 = 1;
                    }
                    uVar38 = UVar6;
                    if (UVar6 == 2) {
                      uVar38 = UVar9;
                    }
                  }
                  if ((uVar23 < 2) ||
                     (((uVar23 + 1 < uVar38 && ((uVar23 + 2 < uVar38 || (UVar10 < 0x200)))) &&
                      ((uVar23 + 3 < uVar38 || (UVar10 < 0x8000)))))) {
                    if ((uVar8 == 2) || (uVar38 < 2)) goto LAB_0019febf;
                    UVar6 = ReadMatchDistances(p,local_90);
                    p->longestMatchLength = UVar6;
                    if (1 < UVar6) {
                      uVar8 = p->matches[p->numPairs - 1];
                      if ((UVar6 < uVar38) || (UVar10 <= uVar8)) {
                        if ((uVar38 + 1 < UVar6) || (UVar6 == uVar38 + 1 && uVar8 >> 7 <= UVar10))
                        goto LAB_0019febf;
                        if (((uVar38 < 3) || (UVar6 + 1 < uVar38)) || (UVar10 >> 7 <= uVar8))
                        goto LAB_001a0a3e;
                      }
LAB_001a024e:
                      uVar36 = 0xffffffff;
                      goto LAB_001a00d5;
                    }
LAB_001a0a3e:
                    pBVar12 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                    lVar29 = 0;
                    do {
                      if ((pBVar12[-1] == pBVar12[~(ulong)(local_158[lVar29] + 1)]) &&
                         (lVar33 = -(ulong)(local_158[lVar29] + 1), *pBVar12 == pBVar12[lVar33])) {
                        if (uVar38 - 1 < 3) {
LAB_001a0acd:
                          uVar36 = 0xffffffff;
                          goto LAB_001a00d5;
                        }
                        lVar34 = 0;
                        while (pBVar12[lVar34 + 1] == pBVar12[lVar34 + lVar33 + 1]) {
                          lVar34 = lVar34 + 1;
                          if ((ulong)(uVar38 - 1) - 2 == lVar34) goto LAB_001a0acd;
                        }
                      }
                      lVar29 = lVar29 + 1;
                    } while (lVar29 != 4);
                    local_248 = UVar10 + 4;
                    uVar36 = (ulong)local_248;
                    UVar6 = uVar38 - 2;
                    if (UVar6 == 0) {
                      uVar8 = 2;
                      goto LAB_001a028b;
                    }
                  }
                  else {
                    UVar6 = uVar23 - 1;
                    uVar38 = uVar23;
                    local_248 = (uint)uVar21;
                  }
                }
                else {
                  uVar39 = p->matches[local_1d8[0] - 1] + 4;
                  uVar36 = (ulong)uVar39;
joined_r0x001a026d:
                  local_248 = uVar39;
                  UVar6 = uVar38 - 1;
                  uVar8 = 1;
                  if (UVar6 == 0) goto LAB_001a028b;
                }
                UVar10 = local_248;
                p->additionalOffset = p->additionalOffset + UVar6;
                (*(p->matchFinder).Skip)(p->matchFinderObj,UVar6);
                uVar36 = (ulong)UVar10;
                uVar8 = uVar38;
              }
            }
LAB_001a028b:
            pCVar25 = local_180;
            uVar7 = (uint)uVar35;
            uVar38 = p->pbMask & uVar7;
            uVar23 = (uint)uVar36;
            if ((uVar8 == 1) && (uVar23 == 0xffffffff)) {
              RangeEnc_EncodeBit(local_180,local_1e8[p->state] + uVar38,0);
              pBVar12 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
              bVar5 = (byte)p->lc;
              iVar26 = (uint)(pBVar12[-1 - (ulong)p->additionalOffset] >> (8 - bVar5 & 0x1f)) +
                       ((p->lpMask & uVar7) << (bVar5 & 0x1f));
              pUVar3 = p->litProbs;
              uVar23 = (uint)pBVar12[-(ulong)p->additionalOffset];
              if (p->state < 7) {
                uVar23 = uVar23 | 0x100;
                do {
                  RangeEnc_EncodeBit(pCVar25,(UInt16 *)
                                             ((long)pUVar3 +
                                             (ulong)(uVar23 >> 7 & 0x1fffffe) +
                                             (ulong)(uint)(iVar26 * 0x300) * 2),uVar23 >> 7 & 1);
                  bVar40 = uVar23 < 0x8000;
                  uVar23 = uVar23 * 2;
                } while (bVar40);
              }
              else {
                uVar38 = (uint)(pBVar12 + -(ulong)p->additionalOffset)[~(ulong)*local_158];
                uVar39 = 0x100;
                uVar23 = uVar23 | 0x100;
                do {
                  uVar38 = uVar38 * 2;
                  RangeEnc_EncodeBit(pCVar25,pUVar3 + (ulong)(uint)(iVar26 * 0x300) +
                                                      (ulong)((uVar23 >> 8) + uVar39 +
                                                             (uVar38 & uVar39)),uVar23 >> 7 & 1);
                  uVar39 = uVar39 & ~(uVar23 * 2 ^ uVar38);
                  bVar40 = uVar23 < 0x8000;
                  uVar23 = uVar23 * 2;
                } while (bVar40);
              }
              p->state = *(UInt32 *)(kLiteralNextStates + (ulong)p->state * 4);
            }
            else {
              RangeEnc_EncodeBit(local_180,local_1e8[p->state] + uVar38,1);
              if (uVar23 < 4) {
                RangeEnc_EncodeBit(pCVar25,local_120 + p->state,1);
                if (uVar23 == 0) {
                  RangeEnc_EncodeBit(pCVar25,local_1c0 + p->state,0);
                  RangeEnc_EncodeBit(pCVar25,local_198[p->state] + uVar38,(uint)(uVar8 != 1));
                }
                else {
                  UVar6 = p->reps[uVar36 & 0xffffffff];
                  RangeEnc_EncodeBit(pCVar25,local_1c0 + p->state,1);
                  if (uVar23 == 1) {
                    RangeEnc_EncodeBit(pCVar25,local_60 + p->state,0);
                  }
                  else {
                    RangeEnc_EncodeBit(pCVar25,local_60 + p->state,1);
                    RangeEnc_EncodeBit(pCVar25,local_78 + p->state,uVar23 - 2);
                    if (uVar23 == 3) {
                      p->reps[3] = p->reps[2];
                    }
                    p->reps[2] = p->reps[1];
                    pCVar25 = local_180;
                  }
                  p->reps[1] = p->reps[0];
                  p->reps[0] = UVar6;
                }
                if (uVar8 == 1) {
                  uVar23 = p->state;
                  puVar16 = kShortRepNextStates;
                }
                else {
                  LenEnc_Encode2(local_68,pCVar25,uVar8 - 2,uVar38,(uint)(p->fastMode == 0),
                                 local_238);
                  uVar23 = p->state;
                  puVar16 = kRepNextStates;
                }
                p->state = *(UInt32 *)(puVar16 + (ulong)uVar23 * 4);
              }
              else {
                RangeEnc_EncodeBit(pCVar25,local_120 + p->state,0);
                p->state = *(UInt32 *)(kMatchNextStates + (ulong)p->state * 4);
                LenEnc_Encode2(local_48,pCVar25,uVar8 - 2,uVar38,(uint)(p->fastMode == 0),local_238)
                ;
                paUVar4 = local_50;
                pCVar25 = local_180;
                local_248 = uVar23 - 4;
                local_228 = CONCAT44(local_228._4_4_,local_248);
                if (local_248 < 0x80) {
                  uVar35 = (ulong)p->g_FastPos[local_248];
                }
                else {
                  iVar26 = 0x12;
                  if ((int)(uVar23 - 0x80004) < 0) {
                    iVar26 = 6;
                  }
                  uVar35 = (ulong)((uint)p->g_FastPos[local_248 >> (sbyte)iVar26] + iVar26 * 2);
                }
                uVar7 = uVar8 - 2;
                if (4 < uVar8) {
                  uVar7 = 3;
                }
                uVar36 = 1;
                uVar23 = 5;
                do {
                  uVar38 = (uint)uVar35;
                  bVar40 = (uVar38 >> (uVar23 & 0x1f) & 1) != 0;
                  RangeEnc_EncodeBit(pCVar25,paUVar4[uVar7] + uVar36,(uint)bVar40);
                  pUVar3 = local_88;
                  p_00 = local_180;
                  uVar36 = (ulong)((uint)bVar40 + (int)uVar36 * 2);
                  bVar40 = uVar23 != 0;
                  uVar23 = uVar23 - 1;
                } while (bVar40);
                if (3 < uVar38) {
                  iVar26 = (int)(uVar35 >> 1);
                  iVar24 = iVar26 + -1;
                  uVar7 = (uVar38 & 1 | 2) << ((byte)iVar24 & 0x1f);
                  uVar23 = (UInt32)local_228 - uVar7;
                  uVar35 = (ulong)uVar23;
                  if (uVar38 < 0xe) {
                    uVar36 = 1;
                    do {
                      uVar23 = (uint)uVar35 & 1;
                      RangeEnc_EncodeBit(p_00,(UInt16 *)
                                              ((long)pUVar3 +
                                              uVar36 * 2 +
                                              ((ulong)uVar7 * 2 - (ulong)(uVar38 * 2)) + -2),uVar23)
                      ;
                      uVar36 = (ulong)(uVar23 + (int)uVar36 * 2);
                      uVar35 = uVar35 >> 1;
                      iVar24 = iVar24 + -1;
                    } while (iVar24 != 0);
                  }
                  else {
                    RangeEnc_EncodeDirectBits(local_180,uVar23 >> 4,iVar26 + -5);
                    pUVar3 = local_80;
                    uVar35 = (ulong)(uVar23 & 0xf);
                    uVar7 = 1;
                    iVar26 = 4;
                    do {
                      uVar23 = (uint)uVar35 & 1;
                      RangeEnc_EncodeBit(p_00,pUVar3 + uVar7,uVar23);
                      uVar7 = uVar23 + uVar7 * 2;
                      uVar35 = uVar35 >> 1;
                      iVar26 = iVar26 + -1;
                    } while (iVar26 != 0);
                    p->alignPriceCount = p->alignPriceCount + 1;
                  }
                }
                p->reps[3] = p->reps[2];
                *(undefined8 *)(p->reps + 1) = *(undefined8 *)p->reps;
                p->reps[0] = (UInt32)local_228;
                p->matchPriceCount = p->matchPriceCount + 1;
                uVar7 = (uint)local_220;
              }
            }
            uVar35 = (ulong)(uVar7 + uVar8);
            pUVar15 = &p->additionalOffset;
            *pUVar15 = *pUVar15 - uVar8;
          } while (*pUVar15 != 0);
          if (p->fastMode == 0) {
            if (0x7f < p->matchPriceCount) {
              FillDistancesPrices(p);
            }
            if (0xf < p->alignPriceCount) {
              FillAlignPrices(p);
            }
          }
          UVar6 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
          if (UVar6 == 0) break;
          uVar8 = (uVar7 + uVar8) - (int)local_f8;
          if (local_cc == 0) {
            if (0x7fff < uVar8) {
              p->nowPos64 = p->nowPos64 + (ulong)uVar8;
              if (p->result != 0) {
                return p->result;
              }
              if ((p->rc).res == 0) {
                if ((p->matchFinderBase).result == 0) {
                  return 0;
                }
              }
              else {
                p->result = 9;
                if ((p->matchFinderBase).result == 0) {
                  iVar26 = 9;
                  goto LAB_001a2601;
                }
              }
              p->result = 8;
              iVar26 = 8;
LAB_001a2601:
              p->finished = 1;
              return iVar26;
            }
          }
          else if ((local_d0 <= uVar8 + 0x112c) ||
                  (local_40 <=
                   (p->rc).buf +
                   (p->rc).cacheSize + ((p->rc).processed - (long)(p->rc).bufBase) + 0x2000)) break;
        } while( true );
      }
      UVar6 = (UInt32)uVar35;
      p->nowPos64 = p->nowPos64 + (ulong)(UVar6 - (int)local_f8);
LAB_001a2586:
      SVar11 = Flush(p,UVar6);
      return SVar11;
    }
  }
  else {
    p->result = 9;
    if ((p->matchFinderBase).result == 0) {
      iVar26 = 9;
      goto LAB_0019fbb3;
    }
  }
  p->result = 8;
  iVar26 = 8;
LAB_0019fbb3:
  p->finished = 1;
  return iVar26;
}

Assistant:

static SRes LzmaEnc_CodeOneBlock(CLzmaEnc* p, Bool useLimits, UInt32 maxPackSize, UInt32 maxUnpackSize) {
  UInt32 nowPos32, startPos32;
  if (p->inStream != 0) {
    p->matchFinderBase.stream = p->inStream;
    p->matchFinder.Init(p->matchFinderObj);
    p->inStream = 0;
  }

  if (p->finished)
    return p->result;
  RINOK(CheckErrors(p));

  nowPos32 = (UInt32)p->nowPos64;
  startPos32 = nowPos32;

  if (p->nowPos64 == 0) {
    UInt32 numPairs;
    Byte curByte;
    if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) == 0)
      return Flush(p, nowPos32);
    ReadMatchDistances(p, &numPairs);
    RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][0], 0);
    p->state = kLiteralNextStates[p->state];
    curByte = p->matchFinder.GetIndexByte(p->matchFinderObj, 0 - p->additionalOffset);
    LitEnc_Encode(&p->rc, p->litProbs, curByte);
    p->additionalOffset--;
    nowPos32++;
  }

  if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) != 0)
    for (;;) {
      UInt32 pos, len, posState;

      if (p->fastMode)
        len = GetOptimumFast(p, &pos);
      else
        len = GetOptimum(p, nowPos32, &pos);

#ifdef SHOW_STAT2
      printf("\n pos = %4X,   len = %d   pos = %d", nowPos32, len, pos);
#endif

      posState = nowPos32 & p->pbMask;
      if (len == 1 && pos == (UInt32)-1) {
        Byte curByte;
        CLzmaProb* probs;
        const Byte* data;

        RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][posState], 0);
        data = p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - p->additionalOffset;
        curByte = *data;
        probs = LIT_PROBS(nowPos32, *(data - 1));
        if (IsCharState(p->state))
          LitEnc_Encode(&p->rc, probs, curByte);
        else
          LitEnc_EncodeMatched(&p->rc, probs, curByte, *(data - p->reps[0] - 1));
        p->state = kLiteralNextStates[p->state];
      } else {
        RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][posState], 1);
        if (pos < LZMA_NUM_REPS) {
          RangeEnc_EncodeBit(&p->rc, &p->isRep[p->state], 1);
          if (pos == 0) {
            RangeEnc_EncodeBit(&p->rc, &p->isRepG0[p->state], 0);
            RangeEnc_EncodeBit(&p->rc, &p->isRep0Long[p->state][posState], ((len == 1) ? 0 : 1));
          } else {
            UInt32 distance = p->reps[pos];
            RangeEnc_EncodeBit(&p->rc, &p->isRepG0[p->state], 1);
            if (pos == 1)
              RangeEnc_EncodeBit(&p->rc, &p->isRepG1[p->state], 0);
            else {
              RangeEnc_EncodeBit(&p->rc, &p->isRepG1[p->state], 1);
              RangeEnc_EncodeBit(&p->rc, &p->isRepG2[p->state], pos - 2);
              if (pos == 3)
                p->reps[3] = p->reps[2];
              p->reps[2] = p->reps[1];
            }
            p->reps[1] = p->reps[0];
            p->reps[0] = distance;
          }
          if (len == 1)
            p->state = kShortRepNextStates[p->state];
          else {
            LenEnc_Encode2(&p->repLenEnc, &p->rc, len - LZMA_MATCH_LEN_MIN, posState, !p->fastMode, p->ProbPrices);
            p->state = kRepNextStates[p->state];
          }
        } else {
          UInt32 posSlot;
          RangeEnc_EncodeBit(&p->rc, &p->isRep[p->state], 0);
          p->state = kMatchNextStates[p->state];
          LenEnc_Encode2(&p->lenEnc, &p->rc, len - LZMA_MATCH_LEN_MIN, posState, !p->fastMode, p->ProbPrices);
          pos -= LZMA_NUM_REPS;
          GetPosSlot(pos, posSlot);
          RcTree_Encode(&p->rc, p->posSlotEncoder[GetLenToPosState(len)], kNumPosSlotBits, posSlot);

          if (posSlot >= kStartPosModelIndex) {
            UInt32 footerBits = ((posSlot >> 1) - 1);
            UInt32 base = ((2 | (posSlot & 1)) << footerBits);
            UInt32 posReduced = pos - base;

            if (posSlot < kEndPosModelIndex)
              RcTree_ReverseEncode(&p->rc, p->posEncoders + base - posSlot - 1, footerBits, posReduced);
            else {
              RangeEnc_EncodeDirectBits(&p->rc, posReduced >> kNumAlignBits, footerBits - kNumAlignBits);
              RcTree_ReverseEncode(&p->rc, p->posAlignEncoder, kNumAlignBits, posReduced & kAlignMask);
              p->alignPriceCount++;
            }
          }
          p->reps[3] = p->reps[2];
          p->reps[2] = p->reps[1];
          p->reps[1] = p->reps[0];
          p->reps[0] = pos;
          p->matchPriceCount++;
        }
      }
      p->additionalOffset -= len;
      nowPos32 += len;
      if (p->additionalOffset == 0) {
        UInt32 processed;
        if (!p->fastMode) {
          if (p->matchPriceCount >= (1 << 7))
            FillDistancesPrices(p);
          if (p->alignPriceCount >= kAlignTableSize)
            FillAlignPrices(p);
        }
        if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) == 0)
          break;
        processed = nowPos32 - startPos32;
        if (useLimits) {
          if (processed + kNumOpts + 300 >= maxUnpackSize ||
              RangeEnc_GetProcessed(&p->rc) + kNumOpts * 2 >= maxPackSize)
            break;
        } else if (processed >= (1 << 15)) {
          p->nowPos64 += nowPos32 - startPos32;
          return CheckErrors(p);
        }
      }
    }
  p->nowPos64 += nowPos32 - startPos32;
  return Flush(p, nowPos32);
}